

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O2

int test_crop(Mat *a,Mat *starts,Mat *ends,Mat *axes)

{
  int iVar1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  Option opt;
  ParamDict pd;
  
  ncnn::ParamDict::ParamDict(&pd);
  ncnn::ParamDict::set(&pd,9,starts);
  ncnn::ParamDict::set(&pd,10,ends);
  ncnn::ParamDict::set(&pd,0xb,axes);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&weights,0,(allocator_type *)&opt);
  ncnn::Option::Option(&opt);
  opt.num_threads = 1;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = true;
  iVar1 = test_layer<ncnn::Crop>("Crop",&pd,&weights,&opt,a,0.001,(_func_void_Crop_ptr *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"test_crop failed a.dims=%d a=(%d %d %d)",(ulong)(uint)a->dims,(ulong)(uint)a->w
            ,(ulong)(uint)a->h,(ulong)(uint)a->c);
    fwrite(" starts=",8,1,_stderr);
    print_int_array(starts);
    fwrite(" ends=",6,1,_stderr);
    print_int_array(ends);
    fwrite(" axes=",6,1,_stderr);
    print_int_array(axes);
    fputc(10,_stderr);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&weights);
  ncnn::ParamDict::~ParamDict(&pd);
  return iVar1;
}

Assistant:

static int test_crop(const ncnn::Mat& a, const ncnn::Mat& starts, const ncnn::Mat& ends, const ncnn::Mat& axes)
{
    ncnn::ParamDict pd;
    pd.set(9, starts);// starts
    pd.set(10, ends);// ends
    pd.set(11, axes);// axes

    std::vector<ncnn::Mat> weights(0);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Crop>("Crop", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_crop failed a.dims=%d a=(%d %d %d)", a.dims, a.w, a.h, a.c);
        fprintf(stderr, " starts="); print_int_array(starts);
        fprintf(stderr, " ends="); print_int_array(ends);
        fprintf(stderr, " axes="); print_int_array(axes);
        fprintf(stderr, "\n");
    }

    return ret;
}